

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mhitu.c
# Opt level: O3

void mayberem(obj *obj,char *str)

{
  schar sVar1;
  char cVar2;
  uint uVar3;
  char *pcVar4;
  char qbuf [128];
  char acStack_128 [264];
  
  if (obj != (obj *)0x0) {
    if (obj->owornmask != 0) {
      uVar3 = mt_random();
      sVar1 = acurr(5);
      if ((int)(uVar3 % 0x14) < (int)sVar1) {
        uVar3 = mt_random();
        if ((uVar3 & 1) == 0) {
          pcVar4 = "lover";
        }
        else {
          uVar3 = mt_random();
          pcVar4 = "sweetheart";
          if ((uVar3 & 1) == 0) {
            pcVar4 = "dear";
          }
        }
        sprintf(acStack_128,"\"Shall I remove your %s, %s?\"",str,pcVar4);
        cVar2 = yn_function(acStack_128,"yn",'n');
        if (cVar2 == 'n') {
          return;
        }
      }
      else {
        pcVar4 = body_part(0xe);
        sprintf(acStack_128,"let me run my fingers through your %s",pcVar4);
        if (uarm == obj) {
          pcVar4 = "let\'s get a little closer";
        }
        else {
          pcVar4 = "it\'s in the way";
          if ((uarmc != obj) && (uarms != obj)) {
            if (uarmf == obj) {
              pcVar4 = "let me rub your feet";
            }
            else if (uarmg == obj) {
              pcVar4 = "they\'re too clumsy";
            }
            else {
              pcVar4 = acStack_128;
              if (uarmu == obj) {
                pcVar4 = "let me massage you";
              }
            }
          }
        }
        verbalize("Take off your %s; %s.",str,pcVar4);
      }
      remove_worn_item(obj,'\x01');
    }
  }
  return;
}

Assistant:

static void mayberem(struct obj *obj, const char *str)
{
	char qbuf[QBUFSZ];

	if (!obj || !obj->owornmask) return;

	if (rn2(20) < ACURR(A_CHA)) {
		sprintf(qbuf,"\"Shall I remove your %s, %s?\"",
			str,
			(!rn2(2) ? "lover" : !rn2(2) ? "dear" : "sweetheart"));
		if (yn(qbuf) == 'n') return;
	} else {
		char hairbuf[BUFSZ];

		sprintf(hairbuf, "let me run my fingers through your %s",
			body_part(HAIR));
		verbalize("Take off your %s; %s.", str,
			(obj == uarm)  ? "let's get a little closer" :
			(obj == uarmc || obj == uarms) ? "it's in the way" :
			(obj == uarmf) ? "let me rub your feet" :
			(obj == uarmg) ? "they're too clumsy" :
			(obj == uarmu) ? "let me massage you" :
			/* obj == uarmh */
			hairbuf);
	}
	remove_worn_item(obj, TRUE);
}